

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppGenerator.cpp
# Opt level: O2

void __thiscall CppGenerator::genMainFunction(CppGenerator *this,bool parallelize)

{
  size_t sVar1;
  TDNode *__rhs;
  ostream *poVar2;
  pointer pcVar3;
  undefined7 in_register_00000031;
  long lVar4;
  pointer pcVar5;
  ulong __val;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_460;
  ulong local_440;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_438;
  undefined4 local_414;
  string local_410;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f0;
  string local_3d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b0;
  string local_390;
  string local_370;
  string local_350;
  string local_330;
  string local_310;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  ofstream ofs;
  
  local_414 = (undefined4)CONCAT71(in_register_00000031,parallelize);
  std::operator+(&local_460,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 multifaq::dir::OUTPUT_DIRECTORY_abi_cxx11_,"main.cpp");
  std::ofstream::ofstream(&ofs,(string *)&local_460,_S_out);
  std::__cxx11::string::~string((string *)&local_460);
  offset_abi_cxx11_(&local_410,this,1);
  std::operator+(&local_3f0,"#ifdef TESTING \n",&local_410);
  std::operator+(&local_438,&local_3f0,"#include <iomanip>\n");
  std::operator+(&local_460,&local_438,"#endif\n");
  std::operator<<((ostream *)&ofs,(string *)&local_460);
  std::__cxx11::string::~string((string *)&local_460);
  std::__cxx11::string::~string((string *)&local_438);
  std::__cxx11::string::~string((string *)&local_3f0);
  std::__cxx11::string::~string((string *)&local_410);
  std::operator<<((ostream *)&ofs,"#include \"DataHandler.h\"\n");
  for (__val = 0;
      __val < (ulong)(((long)(this->viewGroups).
                             super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->viewGroups).
                            super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start) / 0x18); __val = __val + 1) {
    std::__cxx11::to_string(&local_3f0,__val);
    std::operator+(&local_438,"#include \"ComputeGroup",&local_3f0);
    std::operator+(&local_460,&local_438,".h\"\n");
    std::operator<<((ostream *)&ofs,(string *)&local_460);
    std::__cxx11::string::~string((string *)&local_460);
    std::__cxx11::string::~string((string *)&local_438);
    std::__cxx11::string::~string((string *)&local_3f0);
  }
  if (this->_hasApplicationHandler != false) {
    std::operator<<((ostream *)&ofs,"#include \"ApplicationHandler.h\"\n");
  }
  std::operator<<((ostream *)&ofs,"\nnamespace lmfao\n{\n");
  local_440 = 0;
  while( true ) {
    sVar1 = TreeDecomposition::numberOfRelations
                      ((this->_td).super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr);
    if (sVar1 <= local_440) break;
    __rhs = TreeDecomposition::getRelation
                      ((this->_td).super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr,local_440);
    offset_abi_cxx11_(&local_3d0,this,1);
    std::operator+(&local_3b0,&local_3d0,"std::vector<");
    std::operator+(&local_410,&local_3b0,&__rhs->_name);
    std::operator+(&local_3f0,&local_410,"_tuple> ");
    std::operator+(&local_438,&local_3f0,&__rhs->_name);
    std::operator+(&local_460,&local_438,";");
    poVar2 = std::operator<<((ostream *)&ofs,(string *)&local_460);
    std::endl<char,std::char_traits<char>>(poVar2);
    std::__cxx11::string::~string((string *)&local_460);
    std::__cxx11::string::~string((string *)&local_438);
    std::__cxx11::string::~string((string *)&local_3f0);
    std::__cxx11::string::~string((string *)&local_410);
    std::__cxx11::string::~string((string *)&local_3b0);
    std::__cxx11::string::~string((string *)&local_3d0);
    local_440 = local_440 + 1;
  }
  lVar4 = 0;
  local_440 = 0;
  while( true ) {
    sVar1 = QueryCompiler::numberOfViews
                      ((this->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr);
    if (sVar1 <= local_440) break;
    offset_abi_cxx11_(&local_3d0,this,1);
    std::operator+(&local_3b0,&local_3d0,"std::vector<");
    std::operator+(&local_410,&local_3b0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&(this->viewName->_M_dataplus)._M_p + lVar4));
    std::operator+(&local_3f0,&local_410,"_tuple> ");
    std::operator+(&local_438,&local_3f0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&(this->viewName->_M_dataplus)._M_p + lVar4));
    std::operator+(&local_460,&local_438,";");
    poVar2 = std::operator<<((ostream *)&ofs,(string *)&local_460);
    std::endl<char,std::char_traits<char>>(poVar2);
    std::__cxx11::string::~string((string *)&local_460);
    std::__cxx11::string::~string((string *)&local_438);
    std::__cxx11::string::~string((string *)&local_3f0);
    std::__cxx11::string::~string((string *)&local_410);
    std::__cxx11::string::~string((string *)&local_3b0);
    std::__cxx11::string::~string((string *)&local_3d0);
    local_440 = local_440 + 1;
    lVar4 = lVar4 + 0x20;
  }
  genLoadRelationFunction_abi_cxx11_(&local_460,this);
  poVar2 = std::operator<<((ostream *)&ofs,(string *)&local_460);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::~string((string *)&local_460);
  pcVar5 = (pointer)0x0;
  while( true ) {
    local_438._M_dataplus._M_p = pcVar5;
    pcVar3 = (pointer)TreeDecomposition::numberOfRelations
                                ((this->_td).
                                 super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr);
    if (pcVar3 <= pcVar5) break;
    genSortFunction_abi_cxx11_(&local_460,this,(size_t *)&local_438);
    poVar2 = std::operator<<((ostream *)&ofs,(string *)&local_460);
    std::endl<char,std::char_traits<char>>(poVar2);
    std::__cxx11::string::~string((string *)&local_460);
    pcVar5 = pcVar5 + 1;
  }
  genRunFunction_abi_cxx11_(&local_460,this,local_414._0_1_);
  poVar2 = std::operator<<((ostream *)&ofs,(string *)&local_460);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::~string((string *)&local_460);
  genTestFunction_abi_cxx11_(&local_460,this);
  poVar2 = std::operator<<((ostream *)&ofs,(string *)&local_460);
  genDumpFunction_abi_cxx11_(&local_438,this);
  poVar2 = std::operator<<(poVar2,(string *)&local_438);
  std::operator<<(poVar2,"}\n\n");
  std::__cxx11::string::~string((string *)&local_438);
  std::__cxx11::string::~string((string *)&local_460);
  offset_abi_cxx11_(&local_310,this,1);
  std::operator+(&local_2f0,"int main(int argc, char *argv[])\n{\n",&local_310);
  std::operator+(&local_2d0,&local_2f0,"std::cout << \"run lmfao\" << std::endl;\n");
  offset_abi_cxx11_(&local_330,this,1);
  std::operator+(&local_2b0,&local_2d0,&local_330);
  std::operator+(&local_290,&local_2b0,"lmfao::run();\n");
  std::operator+(&local_270,&local_290,"#ifdef TESTING\n");
  offset_abi_cxx11_(&local_350,this,1);
  std::operator+(&local_250,&local_270,&local_350);
  std::operator+(&local_3d0,&local_250,"lmfao::ouputViewsForTesting();\n#endif\n");
  std::operator+(&local_3b0,&local_3d0,"#ifdef DUMP_OUTPUT\n");
  offset_abi_cxx11_(&local_370,this,1);
  std::operator+(&local_410,&local_3b0,&local_370);
  std::operator+(&local_3f0,&local_410,"lmfao::dumpOutputViews();\n#endif\n");
  offset_abi_cxx11_(&local_390,this,1);
  std::operator+(&local_438,&local_3f0,&local_390);
  std::operator+(&local_460,&local_438,"return 0;\n};\n");
  std::operator<<((ostream *)&ofs,(string *)&local_460);
  std::__cxx11::string::~string((string *)&local_460);
  std::__cxx11::string::~string((string *)&local_438);
  std::__cxx11::string::~string((string *)&local_390);
  std::__cxx11::string::~string((string *)&local_3f0);
  std::__cxx11::string::~string((string *)&local_410);
  std::__cxx11::string::~string((string *)&local_370);
  std::__cxx11::string::~string((string *)&local_3b0);
  std::__cxx11::string::~string((string *)&local_3d0);
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::string::~string((string *)&local_350);
  std::__cxx11::string::~string((string *)&local_270);
  std::__cxx11::string::~string((string *)&local_290);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::__cxx11::string::~string((string *)&local_330);
  std::__cxx11::string::~string((string *)&local_2d0);
  std::__cxx11::string::~string((string *)&local_2f0);
  std::__cxx11::string::~string((string *)&local_310);
  std::ofstream::close();
  std::ofstream::~ofstream(&ofs);
  return;
}

Assistant:

void CppGenerator::genMainFunction(bool parallelize)
{
    std::ofstream ofs(multifaq::dir::OUTPUT_DIRECTORY+"main.cpp",std::ofstream::out);

    ofs << "#ifdef TESTING \n"+offset(1)+"#include <iomanip>\n"+"#endif\n";
    
    ofs << "#include \"DataHandler.h\"\n";
    for (size_t group = 0; group < viewGroups.size(); ++group)
        ofs << "#include \"ComputeGroup"+std::to_string(group)+".h\"\n";

    if (_hasApplicationHandler)
        ofs << "#include \"ApplicationHandler.h\"\n";
    
    ofs << "\nnamespace lmfao\n{\n";    
    // offset(1)+"//const std::std::ring PATH_TO_DATA = \"/Users/Maximilian/Documents/"+
    // "Oxford/LMFAO/"+_pathToData+"\";\n"+
    // offset(1)+"const std::string PATH_TO_DATA = \"../../"+_pathToData+"\";\n\n";

    for (size_t relID = 0; relID < _td->numberOfRelations(); ++relID)
    {
        const std::string& relName = _td->getRelation(relID)->_name;
        ofs << offset(1)+"std::vector<"+relName+"_tuple> "+relName+";" << std::endl;
    }
    
    for (size_t viewID = 0; viewID < _qc->numberOfViews(); ++viewID)
    {
        ofs << offset(1)+"std::vector<"+viewName[viewID]+"_tuple> "+
            viewName[viewID]+";" << std::endl;
    }
    
    ofs << genLoadRelationFunction() << std::endl;

    for (size_t relID = 0; relID < _td->numberOfRelations(); ++relID)
        ofs << genSortFunction(relID) << std::endl;
    
    ofs << genRunFunction(parallelize) << std::endl;
    ofs << genTestFunction() << genDumpFunction() << "}\n\n";
 
    ofs << "int main(int argc, char *argv[])\n{\n"+
        offset(1)+"std::cout << \"run lmfao\" << std::endl;\n"+
        offset(1)+"lmfao::run();\n"+
        "#ifdef TESTING\n"+offset(1)+"lmfao::ouputViewsForTesting();\n#endif\n"+
        "#ifdef DUMP_OUTPUT\n"+offset(1)+"lmfao::dumpOutputViews();\n#endif\n"+
        offset(1)+"return 0;\n};\n";
    ofs.close();
}